

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

void utf8TextClose(UText *ut)

{
  char *s;
  UText *ut_local;
  
  if ((ut->providerProperties & 0x20U) != 0) {
    uprv_free_63(ut->context);
    ut->context = (void *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV
utf8TextClose(UText *ut) {
    // Most of the work of close is done by the generic UText framework close.
    // All that needs to be done here is to delete the UTF8 string if the UText
    //  owns it.  This occurs if the UText was created by cloning.
    if (ut->providerProperties & I32_FLAG(UTEXT_PROVIDER_OWNS_TEXT)) {
        char *s = (char *)ut->context;
        uprv_free(s);
        ut->context = NULL;
    }
}